

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_visualization.cpp
# Opt level: O2

void __thiscall lumeview::SubsetVisualization::prepare_renderer(SubsetVisualization *this)

{
  Renderer *this_00;
  pointer piVar1;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *mesh_00;
  bool bVar3;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  allocator local_f5;
  index_t local_f4;
  shared_ptr<lume::Mesh> mesh;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_c8 [2];
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_98;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_88;
  string local_70;
  string local_50;
  
  local_88._0_8_ = 0x3e4ccccd3e4ccccd;
  local_88._8_8_ = 0x3f8000003e4ccccd;
  piVar1 = (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  p_Var4 = &((this->m_subsetMeshes).
             super__Vector_base<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((this->m_subsetMeshes).
             super__Vector_base<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>;
  this_00 = &this->m_renderer;
  local_f4 = 0;
  for (; p_Var4 != p_Var2; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
    local_c8[0].field_0.x =
         (int)(((long)(this->m_renderer).m_stages.
                      super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_renderer).m_stages.
                     super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xa0);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->m_subsetIndexToStageIndex,(int *)local_c8);
    bVar3 = lume::Mesh::has(mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (GrobSet)0x34);
    mesh_00 = mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_c8[0].field_0,"normals",&local_f5);
      lume::ComputeFaceVertexNormals3(mesh_00,(string *)&local_c8[0].field_0);
      std::__cxx11::string::~string((string *)&local_c8[0].field_0);
      lume::CreateSideGrobs
                (mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
      std::__cxx11::string::string((string *)&local_50,"solid",(allocator *)&local_c8[0].field_0);
      std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,&mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
      Renderer::add_stage(this_00,&local_50,(SPMesh *)&local_98,(GrobSet)0x34,FLAT);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      std::__cxx11::string::~string((string *)&local_50);
      local_c8[0].field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
            )subset_color(this,local_f4);
      Renderer::stage_set_color(this_00,(vec4 *)&local_c8[0].field_0,-1);
      std::__cxx11::string::string((string *)&local_70,"wire",(allocator *)&local_c8[0].field_0);
      std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,&mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
      Renderer::add_stage(this_00,&local_70,(SPMesh *)&local_a8,(GrobSet)0x4,FLAT);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::__cxx11::string::~string((string *)&local_70);
      Renderer::stage_set_color(this_00,(vec4 *)&local_88.field_0,-1);
    }
    local_f4 = local_f4 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void SubsetVisualization::prepare_renderer ()
{
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);

	index_t subsetIndex = 0;
	m_subsetIndexToStageIndex.clear ();
	for(auto mesh : m_subsetMeshes) {

		m_subsetIndexToStageIndex.push_back ((int)m_renderer.num_stages());

		if (mesh->has (FACES)) {
			ComputeFaceVertexNormals3 (*mesh, "normals");
			CreateSideGrobs (*mesh, 1);

			m_renderer.add_stage ("solid", mesh, FACES, FLAT);
			m_renderer.stage_set_color (subset_color (subsetIndex));

			m_renderer.add_stage ("wire", mesh, EDGES, FLAT);
			m_renderer.stage_set_color (wireColor);
		}
		++subsetIndex;
	}
}